

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O1

void __thiscall IDisk::CreateSingleTrackFromMultiRevolutions(IDisk *this,int side,int track)

{
  uint uVar1;
  Revolution *pRVar2;
  void *pvVar3;
  int iVar4;
  uchar *__s;
  MFMTrack *pMVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  ulong uVar9;
  MFMTrack **ppMVar10;
  
  ppMVar10 = &this->side_[side].tracks;
  if ((*ppMVar10)[track].nb_revolutions == 1) {
    pMVar5 = *ppMVar10 + track;
    pRVar2 = pMVar5->revolution;
    pMVar5->bitfield = pRVar2->bitfield;
    pMVar5->size = pRVar2->size;
    piVar7 = &pRVar2[-1].track_info.full_size_;
    lVar6 = *(long *)&pRVar2[-1].track_info.full_size_;
    if (lVar6 != 0) {
      lVar8 = lVar6 * 0x30;
      do {
        pvVar3 = *(void **)((long)pRVar2 + lVar8 + -0x20);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)((long)pRVar2 + lVar8 + -0x10) - (long)pvVar3);
        }
        lVar8 = lVar8 + -0x30;
      } while (lVar8 != 0);
    }
LAB_0014b3da:
    operator_delete__(piVar7,lVar6 * 0x30 + 8);
  }
  else {
    iVar4 = (*this->_vptr_IDisk[0x15])();
    uVar1 = (*ppMVar10)[track].nb_revolutions;
    pMVar5 = *ppMVar10 + track;
    if ((char)iVar4 == '\0') {
      if (uVar1 != 0) {
        lVar6 = 0;
        uVar9 = 0;
        do {
          pvVar3 = *(void **)((long)&pMVar5->revolution->bitfield + lVar6);
          if (pvVar3 != (void *)0x0) {
            operator_delete__(pvVar3);
          }
          uVar9 = uVar9 + 1;
          pMVar5 = *ppMVar10 + track;
          lVar6 = lVar6 + 0x30;
        } while (uVar9 < (*ppMVar10)[track].nb_revolutions);
      }
      pRVar2 = pMVar5->revolution;
      if (pRVar2 != (Revolution *)0x0) {
        lVar6 = *(long *)&pRVar2[-1].track_info.full_size_;
        if (lVar6 != 0) {
          lVar8 = lVar6 * 0x30;
          do {
            pvVar3 = *(void **)((long)pRVar2 + lVar8 + -0x20);
            if (pvVar3 != (void *)0x0) {
              operator_delete(pvVar3,*(long *)((long)pRVar2 + lVar8 + -0x10) - (long)pvVar3);
            }
            lVar8 = lVar8 + -0x30;
          } while (lVar8 != 0);
        }
        operator_delete__(&pRVar2[-1].track_info.full_size_,lVar6 * 0x30 + 8);
      }
      pMVar5 = *ppMVar10;
      pMVar5[track].revolution = (Revolution *)0x0;
      pMVar5[track].nb_revolutions = 0;
      pMVar5[track].bitfield = (uchar *)0x0;
      pMVar5[track].size = 0;
      goto LAB_0014b4a9;
    }
    if (uVar1 != 0) {
      lVar6 = 0;
      uVar9 = 0;
      do {
        pvVar3 = *(void **)((long)&pMVar5->revolution->bitfield + lVar6);
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
        uVar9 = uVar9 + 1;
        pMVar5 = *ppMVar10 + track;
        lVar6 = lVar6 + 0x30;
      } while (uVar9 < (*ppMVar10)[track].nb_revolutions);
    }
    pRVar2 = pMVar5->revolution;
    if (pRVar2 != (Revolution *)0x0) {
      piVar7 = &pRVar2[-1].track_info.full_size_;
      lVar6 = *(long *)&pRVar2[-1].track_info.full_size_;
      if (lVar6 != 0) {
        lVar8 = lVar6 * 0x30;
        do {
          pvVar3 = *(void **)((long)pRVar2 + lVar8 + -0x20);
          if (pvVar3 != (void *)0x0) {
            operator_delete(pvVar3,*(long *)((long)pRVar2 + lVar8 + -0x10) - (long)pvVar3);
          }
          lVar8 = lVar8 + -0x30;
        } while (lVar8 != 0);
      }
      goto LAB_0014b3da;
    }
  }
  pMVar5 = *ppMVar10;
  pMVar5[track].nb_revolutions = 0;
  pMVar5[track].revolution = (Revolution *)0x0;
LAB_0014b4a9:
  pMVar5 = *ppMVar10;
  if (pMVar5[track].bitfield == (uchar *)0x0) {
    pMVar5[track].size = 0x40000;
    __s = (uchar *)operator_new__(0x40000);
    pMVar5[track].bitfield = __s;
    memset(__s,4,0x40000);
    return;
  }
  return;
}

Assistant:

void IDisk::CreateSingleTrackFromMultiRevolutions(int side, int track)
{
   // Only one revolution : Nothing else to add...
   if (side_[side].tracks[track].nb_revolutions == 1)
   {
      side_[side].tracks[track].bitfield = side_[side].tracks[track].revolution[0].bitfield;
      side_[side].tracks[track].size = side_[side].tracks[track].revolution[0].size;

      delete[]side_[side].tracks[track].revolution;
      side_[side].tracks[track].nb_revolutions = 0;
      side_[side].tracks[track].revolution = nullptr;
   }
   else
   {
      // Otherwise
      Track track_buffer;

      if (!CreateTrackFromRevolution(side, track))
      {
         for (unsigned int rev = 0; rev < side_[side].tracks[track].nb_revolutions; rev++)
         {
            delete[]side_[side].tracks[track].revolution[rev].bitfield;
         }
         delete[]side_[side].tracks[track].revolution;
         side_[side].tracks[track].revolution = nullptr;
         side_[side].tracks[track].nb_revolutions = 0;
         side_[side].tracks[track].bitfield = nullptr;
         side_[side].tracks[track].size = 0;
      }
      else
      {
         for (unsigned int rev = 0; rev < side_[side].tracks[track].nb_revolutions; rev++)
         {
            delete[]side_[side].tracks[track].revolution[rev].bitfield;
         }
         delete[]side_[side].tracks[track].revolution;
         side_[side].tracks[track].nb_revolutions = 0;
         side_[side].tracks[track].revolution = nullptr;
      }
   }
   // Now, just clear the Revolution structure.
   if (side_[side].tracks[track].bitfield == nullptr)
   {
      // Set a default (unformatted) track
      side_[side].tracks[track].size = DEFAULT_TRACK_SIZE * 16;
      side_[side].tracks[track].bitfield = new unsigned char[DEFAULT_TRACK_SIZE * 16];
      memset(side_[side].tracks[track].bitfield, BIT_WEAK, DEFAULT_TRACK_SIZE * 16);
   }
}